

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

void parseGBCFile(filebuf *file)

{
  pointer paVar1;
  unsigned_short val;
  uint uVar2;
  long lVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [8];
  byte local_48 [8];
  array<Rgba,_4UL> local_40;
  
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  while( true ) {
    lVar3 = (**(code **)(*(long *)file + 0x40))(file,local_48,8);
    if (lVar3 != 8) break;
    lVar3 = 0;
    uVar2 = 0;
    pbVar4 = local_48;
    do {
      uVar2 = uVar2 | (uint)*pbVar4 << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 8;
      pbVar4 = pbVar4 + 1;
    } while (lVar3 == 8);
    local_40._M_elems[0] = Rgba::fromCGBColor((uint16_t)uVar2);
    lVar3 = 0;
    uVar2 = 0;
    pbVar4 = local_48 + 2;
    do {
      uVar2 = uVar2 | (uint)*pbVar4 << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 8;
      pbVar4 = pbVar4 + 1;
    } while (lVar3 == 8);
    local_40._M_elems[1] = Rgba::fromCGBColor((uint16_t)uVar2);
    lVar3 = 0;
    uVar2 = 0;
    pbVar4 = local_48 + 4;
    do {
      uVar2 = uVar2 | (uint)*pbVar4 << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 8;
      pbVar4 = pbVar4 + 1;
    } while (lVar3 == 8);
    local_40._M_elems[2] = Rgba::fromCGBColor((uint16_t)uVar2);
    lVar3 = 0;
    uVar2 = 0;
    pbVar4 = local_48 + 6;
    do {
      uVar2 = uVar2 | (uint)*pbVar4 << ((byte)lVar3 & 0x1f);
      lVar3 = lVar3 + 8;
      pbVar4 = pbVar4 + 1;
    } while (lVar3 == 8);
    local_40._M_elems[3] = Rgba::fromCGBColor((uint16_t)uVar2);
    paVar1 = options.palSpec.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>>::
      _M_realloc_insert<std::array<Rgba,4ul>>
                ((vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>> *)
                 &options.palSpec,
                 (iterator)
                 options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_40);
    }
    else {
      *(ulong *)(options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems =
           CONCAT44(local_40._M_elems[1],local_40._M_elems[0]);
      *(ulong *)(paVar1->_M_elems + 2) = CONCAT44(local_40._M_elems[3],local_40._M_elems[2]);
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (lVar3 != 0) {
    pcVar6 = "s";
    pcVar5 = "s";
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      pcVar5 = "";
    }
    if (lVar3 == 1) {
      pcVar6 = "";
    }
    error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4,pcVar5,lVar3,pcVar6);
  }
  return;
}

Assistant:

static void parseGBCFile(std::filebuf &file) {
	// This only needs to be able to read back files generated by `rgbgfx -p`
	options.palSpec.clear();

	for (;;) {
		char buf[2 * 4];
		auto len = file.sgetn(buf, sizeof(buf));
		if (len == 0) {
			break;
		} else if (len != sizeof(buf)) {
			error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
			      options.palSpec.size(), options.palSpec.size() == 1 ? "" : "s", len,
			      len == 1 ? "" : "s");
			break;
		}

		options.palSpec.push_back({Rgba::fromCGBColor(readLE<uint16_t>(&buf[0])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[2])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[4])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[6]))});
	}
}